

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_blow_effect1(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  long *local_20;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 != (void *)0x0) {
    for (local_20 = *(long **)((long)pvVar1 + 0x18); *local_20 != 0; local_20 = (long *)*local_20) {
    }
    pcVar2 = parser_getsym(p,"effect");
    pcVar2 = string_make(pcVar2);
    local_20[7] = (long)pcVar2;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x80e,"enum parser_error parse_ghost_blow_effect1(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_blow_effect1(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->blow_effect1 = string_make(parser_getsym(p, "effect"));
	return PARSE_ERROR_NONE;
}